

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O2

Results * wasm::ModuleSplitting::splitFunctions
                    (Results *__return_storage_ptr__,Module *primary,Config *config)

{
  undefined1 local_1b0 [8];
  ModuleSplitter split;
  
  anon_unknown_0::ModuleSplitter::ModuleSplitter((ModuleSplitter *)local_1b0,primary,config);
  (__return_storage_ptr__->secondary)._M_t.
  super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl = (Module *)split.config;
  split.config = (Config *)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header,
             (_Rb_tree_header *)&split.placeholderMap);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
               *)&split.exportedPrimaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)&split.minified);
  anon_unknown_0::TableSlotManager::~TableSlotManager((TableSlotManager *)&split.secondaryFuncs);
  std::
  pair<std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
  ::~pair((pair<std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
           *)&split.secondary);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&split);
  return __return_storage_ptr__;
}

Assistant:

Results splitFunctions(Module& primary, const Config& config) {
  ModuleSplitter split(primary, config);
  return {std::move(split.secondaryPtr), std::move(split.placeholderMap)};
}